

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_wakeupvm(HSQUIRRELVM v,SQBool wakeupret,SQBool retval,SQBool raiseerror,
                    SQBool throwerror)

{
  SQObjectPtr *this;
  int iVar1;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  SQObjectPtr dummy;
  SQInteger target;
  SQObjectPtr ret;
  SQBool in_stack_00000368;
  SQObjectPtr *in_stack_00000370;
  SQInteger in_stack_00000378;
  SQInteger in_stack_00000380;
  SQObjectPtr *in_stack_00000388;
  SQVM *in_stack_00000390;
  ExecutionType in_stack_000003b0;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  SQObjectPtr *in_stack_ffffffffffffff78;
  SQObjectPtr local_68;
  long local_58;
  undefined4 local_50;
  SQObjectPtr local_40;
  long local_30;
  long local_20;
  long local_18;
  long local_10;
  SQRESULT local_8;
  
  local_30 = in_R8;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  SQObjectPtr::SQObjectPtr(&local_40);
  if (*(long *)(local_10 + 0x138) == 0) {
    local_8 = sq_throwerror((HSQUIRRELVM)
                            CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                            (SQChar *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68))
    ;
    local_50 = 1;
  }
  else {
    local_58 = *(long *)(local_10 + 0x148);
    if (local_18 == 0) {
      if (local_58 != -1) {
        SQVM::GetAt((SQVM *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                    CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        SQObjectPtr::Null((SQObjectPtr *)
                          CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
      }
    }
    else {
      if (local_58 != -1) {
        SQVM::GetUp((SQVM *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                    CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        this = SQVM::GetAt((SQVM *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        SQObjectPtr::operator=(this,in_stack_ffffffffffffff78);
      }
      SQVM::Pop((SQVM *)0x119d9e);
    }
    SQObjectPtr::SQObjectPtr(&local_68);
    iVar1 = 3 - (uint)(local_30 == 0);
    in_stack_ffffffffffffff77 =
         SQVM::Execute(in_stack_00000390,in_stack_00000388,in_stack_00000380,in_stack_00000378,
                       in_stack_00000370,in_stack_00000368,in_stack_000003b0);
    if ((bool)in_stack_ffffffffffffff77) {
      if (local_20 != 0) {
        SQVM::Push((SQVM *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                   (SQObjectPtr *)CONCAT44(in_stack_ffffffffffffff6c,iVar1));
      }
      local_8 = 0;
    }
    else {
      local_8 = -1;
    }
    local_50 = 1;
    SQObjectPtr::~SQObjectPtr
              ((SQObjectPtr *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  }
  SQObjectPtr::~SQObjectPtr
            ((SQObjectPtr *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  return local_8;
}

Assistant:

SQRESULT sq_wakeupvm(HSQUIRRELVM v,SQBool wakeupret,SQBool retval,SQBool raiseerror,SQBool throwerror)
{
    SQObjectPtr ret;
    if(!v->_suspended)
        return sq_throwerror(v,_SC("cannot resume a vm that is not running any code"));
    SQInteger target = v->_suspended_target;
    if(wakeupret) {
        if(target != -1) {
            v->GetAt(v->_stackbase+v->_suspended_target)=v->GetUp(-1); //retval
        }
        v->Pop();
    } else if(target != -1) { v->GetAt(v->_stackbase+v->_suspended_target).Null(); }
    SQObjectPtr dummy;
    if(!v->Execute(dummy,-1,-1,ret,raiseerror,throwerror?SQVM::ET_RESUME_THROW_VM : SQVM::ET_RESUME_VM)) {
        return SQ_ERROR;
    }
    if(retval)
        v->Push(ret);
    return SQ_OK;
}